

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recog_intel.c
# Opt level: O0

int cpuid_identify_intel(cpu_raw_data_t *raw,cpu_id_t *data,internal_id_info_t *internal)

{
  int iVar1;
  cpu_purpose_t cVar2;
  amd_code_t brand_code;
  intel_model_t model_code_00;
  uint64_t mask;
  intel_code_and_bits_t iVar3;
  char *local_40;
  char *brand_code_str;
  int i;
  intel_model_t model_code;
  intel_code_and_bits_t brand;
  internal_id_info_t *internal_local;
  cpu_id_t *data_local;
  cpu_raw_data_t *raw_local;
  
  local_40 = (char *)0x0;
  load_intel_features(raw,data);
  if (raw->basic_cpuid[0][0] < 4) {
    if (1 < raw->basic_cpuid[0][0]) {
      decode_intel_oldstyle_cache_info(raw,data);
    }
  }
  else {
    decode_deterministic_cache_info_x86(raw->intel_fn4,'\b',data,internal);
  }
  if ((raw->basic_cpuid[0][0] < 0xb) ||
     (iVar1 = decode_intel_extended_topology(raw,data), iVar1 == 0)) {
    decode_number_of_cores_x86(raw,data);
  }
  cVar2 = cpuid_identify_purpose_intel(raw);
  data->purpose = cVar2;
  decode_architecture_version_x86(data);
  iVar3 = get_brand_code_and_bits(data);
  mask = iVar3.bits;
  brand_code = iVar3.code;
  model_code_00 = get_model_code(data);
  brand_code_str._0_4_ = 0;
  do {
    if (0x16 < (uint)brand_code_str) {
LAB_00114b2e:
      if (local_40 == (char *)0x0) {
        debugf(2,"Detected Intel brand code: %d\n",brand_code);
      }
      else {
        debugf(2,"Detected Intel brand code: %d (%s)\n",brand_code,local_40);
      }
      if (mask != 0) {
        debugf(2,"Detected Intel bits: ");
        debug_print_lbits(2,mask);
      }
      debugf(2,"Detected Intel model code: %d\n",(ulong)(uint)model_code_00);
      (internal->code).amd = brand_code;
      internal->bits = mask;
      if (data->flags[0x6b] != '\0') {
        debugf(2,"SGX seems to be present, decoding...\n");
        decode_intel_sgx_features(raw,data);
      }
      iVar1 = match_cpu_codename(cpudb_intel,0x1a2,data,brand_code,mask,model_code_00);
      internal->score = iVar1;
      return 0;
    }
    if (brand_code == intel_bcode_str[(int)(uint)brand_code_str].code) {
      local_40 = intel_bcode_str[(int)(uint)brand_code_str].str;
      goto LAB_00114b2e;
    }
    brand_code_str._0_4_ = (uint)brand_code_str + 1;
  } while( true );
}

Assistant:

int cpuid_identify_intel(struct cpu_raw_data_t* raw, struct cpu_id_t* data, struct internal_id_info_t* internal)
{
	intel_code_and_bits_t brand;
	intel_model_t model_code;
	int i;
	char* brand_code_str = NULL;

	load_intel_features(raw, data);
	if (raw->basic_cpuid[0][EAX] >= 4) {
		/* Deterministic way is preferred, being more generic */
		decode_deterministic_cache_info_x86(raw->intel_fn4, MAX_INTELFN4_LEVEL, data, internal);
	} else if (raw->basic_cpuid[0][EAX] >= 2) {
		decode_intel_oldstyle_cache_info(raw, data);
	}
	if ((raw->basic_cpuid[0][EAX] < 11) || (decode_intel_extended_topology(raw, data) == 0))
		decode_number_of_cores_x86(raw, data);
	data->purpose = cpuid_identify_purpose_intel(raw);
	decode_architecture_version_x86(data);

	brand = get_brand_code_and_bits(data);
	model_code = get_model_code(data);
	for (i = 0; i < COUNT_OF(intel_bcode_str); i++) {
		if (brand.code == intel_bcode_str[i].code) {
			brand_code_str = intel_bcode_str[i].str;
			break;
		}
	}
	if (brand_code_str)
		debugf(2, "Detected Intel brand code: %d (%s)\n", brand.code, brand_code_str);
	else
		debugf(2, "Detected Intel brand code: %d\n", brand.code);
	if (brand.bits) {
		debugf(2, "Detected Intel bits: ");
		debug_print_lbits(2, brand.bits);
	}
	debugf(2, "Detected Intel model code: %d\n", model_code);

	internal->code.intel = brand.code;
	internal->bits = brand.bits;

	if (data->flags[CPU_FEATURE_SGX]) {
		debugf(2, "SGX seems to be present, decoding...\n");
		// if SGX is indicated by the CPU, verify its presence:
		decode_intel_sgx_features(raw, data);
	}

	internal->score = match_cpu_codename(cpudb_intel, COUNT_OF(cpudb_intel), data,
		brand.code, brand.bits, model_code);
	return 0;
}